

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall
QtPrivate::QCalendarDateValidator::~QCalendarDateValidator(QCalendarDateValidator *this)

{
  clear(this);
  QCalendarDateSectionValidator::~QCalendarDateSectionValidator
            (&(this->m_dayValidator).super_QCalendarDateSectionValidator);
  QCalendarDateSectionValidator::~QCalendarDateSectionValidator
            (&(this->m_monthValidator).super_QCalendarDateSectionValidator);
  QCalendarDateSectionValidator::~QCalendarDateSectionValidator
            (&(this->m_yearValidator).super_QCalendarDateSectionValidator);
  std::_Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>::
  ~_Vector_base(&(this->m_tokens).
                 super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>
               );
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)this);
  return;
}

Assistant:

QCalendarDateValidator::~QCalendarDateValidator()
{
    clear();
}